

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

int hydro_hash_init_with_tweak(hydro_hash_state *state,char *ctx,uint64_t tweak,uint8_t *key)

{
  undefined8 *in_RCX;
  uint64_t in_RDX;
  undefined8 *in_RSI;
  void *in_RDI;
  size_t p;
  uint8_t block [80];
  long local_80;
  uint8_t local_78 [6];
  undefined8 local_72;
  undefined1 auStackY_6a [2];
  undefined1 local_68;
  undefined7 local_67;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  
  memset(local_78,0,0x50);
  builtin_memcpy(local_78,"\x04tmac\b",6);
  mem_zero(auStackY_6a,0x42);
  local_72 = *in_RSI;
  if (in_RCX == (undefined8 *)0x0) {
    local_68 = 0;
    local_80 = 0x20;
  }
  else {
    local_68 = 0x20;
    local_67 = (undefined7)*in_RCX;
    in_stack_ffffffffffffffa0 = (undefined1)((ulong)*in_RCX >> 0x38);
    in_stack_ffffffffffffffa1 = (undefined7)in_RCX[1];
    in_stack_ffffffffffffffa8 = (undefined1)((ulong)in_RCX[1] >> 0x38);
    in_stack_ffffffffffffffa9 = (undefined7)in_RCX[2];
    in_stack_ffffffffffffffb0 = (undefined1)((ulong)in_RCX[2] >> 0x38);
    in_stack_ffffffffffffffb1 = (undefined7)in_RCX[3];
    local_80 = 0x40;
  }
  local_78[local_80] = '\b';
  store64_le(local_78 + local_80 + 1,in_RDX);
  mem_zero(in_RDI,0x34);
  hydro_hash_update((hydro_hash_state *)
                    CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                    (void *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
                    CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0));
  return 0;
}

Assistant:

static int
hydro_hash_init_with_tweak(hydro_hash_state *state, const char ctx[hydro_hash_CONTEXTBYTES],
                           uint64_t tweak, const uint8_t key[hydro_hash_KEYBYTES])
{
    uint8_t block[80] = { 4, 't', 'm', 'a', 'c', 8 };
    size_t  p;

    COMPILER_ASSERT(hydro_hash_KEYBYTES <= sizeof block - 2 * gimli_RATE - 1);
    COMPILER_ASSERT(hydro_hash_CONTEXTBYTES == 8);
    mem_zero(block + 14, sizeof block - 14);
    memcpy(block + 6, ctx, 8);
    if (key != NULL) {
        block[gimli_RATE] = (uint8_t) hydro_hash_KEYBYTES;
        memcpy(block + gimli_RATE + 1, key, hydro_hash_KEYBYTES);
        p = (gimli_RATE + 1 + hydro_hash_KEYBYTES + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    } else {
        block[gimli_RATE] = (uint8_t) 0;
        p                 = (gimli_RATE + 1 + 0 + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    }
    block[p] = (uint8_t) sizeof tweak;
    STORE64_LE(&block[p + 1], tweak);
    p += gimli_RATE;
    mem_zero(state, sizeof *state);
    hydro_hash_update(state, block, p);

    return 0;
}